

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::Canceler::AdapterImpl<void>::AdapterImpl
          (AdapterImpl<void> *this,PromiseFulfiller<void> *fulfiller,Canceler *canceler,
          Promise<void> *inner)

{
  PromiseNode *pPVar1;
  PromiseArena *pPVar2;
  SourceLocation location;
  void *pvVar3;
  TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:273:11),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:274:11)>
  *location_00;
  void *continuationTracePtr;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_70;
  anon_class_8_1_a7efefcd_for_errorHandler local_68;
  anon_class_8_1_a7efefcd_for_func local_60;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_58;
  code *local_50;
  char *local_48;
  char *pcStack_40;
  undefined8 local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  
  AdapterBase::AdapterBase(&this->super_AdapterBase,canceler);
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR_cancel_0036ccb8;
  this->fulfiller = fulfiller;
  local_50 = kj::_::
             TransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:273:11),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++:274:11)>
             ::anon_class_8_1_a7efefcd_for_func::operator();
  pPVar1 = (inner->super_PromiseBase).node.ptr;
  pPVar2 = (pPVar1->super_PromiseArenaMember).arena;
  local_68.fulfiller = fulfiller;
  local_60.fulfiller = fulfiller;
  if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pPVar1 - (long)pPVar2) < 0x30) {
    pvVar3 = operator_new(0x400);
    location_00 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:273:11),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:274:11)>
                   *)((long)pvVar3 + 0x3d0);
    ctor<kj::_::TransformPromiseNode<void,kj::Canceler::AdapterImpl<void>::AdapterImpl(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::__0,kj::Canceler::AdapterImpl<void>::__0(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Canceler::AdapterImpl<void>::AdapterImpl(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::__0,kj::Canceler::AdapterImpl<void>::__0(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::__1,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)inner,&local_60,
               &local_68,&local_50);
    *(void **)((long)pvVar3 + 0x3d8) = pvVar3;
  }
  else {
    (pPVar1->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
    location_00 = (TransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:273:11),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_c__:274:11)>
                   *)(pPVar1 + -3);
    ctor<kj::_::TransformPromiseNode<void,kj::Canceler::AdapterImpl<void>::AdapterImpl(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::__0,kj::Canceler::AdapterImpl<void>::__0(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::__1>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::Canceler::AdapterImpl<void>::AdapterImpl(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::__0,kj::Canceler::AdapterImpl<void>::__0(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::__1,void*&>
              (location_00,(Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)inner,&local_60,
               &local_68,&local_50);
    pPVar1[-3].super_PromiseArenaMember.arena = pPVar2;
  }
  local_58.ptr = (PromiseNode *)0x0;
  local_30.ptr = (PromiseNode *)0x0;
  local_70.ptr = (PromiseNode *)location_00;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_30);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_58);
  local_48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++";
  pcStack_40 = "AdapterImpl";
  local_38 = 0xd00000110;
  location.function = "AdapterImpl";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
  ;
  location.lineNumber = 0x110;
  location.columnNumber = 0xd;
  Promise<void>::eagerlyEvaluate(&this->inner,&local_70,location);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_70);
  return;
}

Assistant:

Canceler::AdapterImpl<void>::AdapterImpl(kj::PromiseFulfiller<void>& fulfiller,
            Canceler& canceler, kj::Promise<void> inner)
    : AdapterBase(canceler),
      fulfiller(fulfiller),
      inner(inner.then(
          [&fulfiller]() { fulfiller.fulfill(); },
          [&fulfiller](kj::Exception&& e) { fulfiller.reject(kj::mv(e)); })
          .eagerlyEvaluate(nullptr)) {}